

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O1

void MapIncludesToDependencies
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *includeLookup,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *ambiguous,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
               *components,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
               *files)

{
  _Base_ptr p_Var1;
  mapped_type pCVar2;
  size_type sVar3;
  int iVar4;
  const_iterator cVar5;
  iterator iVar6;
  mapped_type *__k;
  long lVar7;
  mapped_type *this;
  long *plVar8;
  mapped_type *ppCVar9;
  _Rb_tree_node_base *p_Var10;
  char *pcVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  _Hash_node_base *p_Var13;
  _Base_ptr p_Var14;
  File *dep;
  string lowercaseInclude;
  File *dep_1;
  __hashtable *__h;
  string fullFilePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_f8 [2];
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  local_e8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_d8;
  key_type local_d0;
  mapped_type local_b0 [2];
  undefined1 local_a0 [40];
  key_type local_78;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_58;
  __node_base local_50;
  value_type *local_48;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  _Rb_tree_node_base *local_38;
  
  p_Var13 = (files->_M_h)._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    local_d8 = &files->_M_h;
    local_58 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)components;
    local_50._M_nxt = (_Hash_node_base *)ambiguous;
    local_40 = includeLookup;
    do {
      p_Var10 = (_Rb_tree_node_base *)p_Var13[0xc]._M_nxt;
      local_38 = (_Rb_tree_node_base *)(p_Var13 + 10);
      if (p_Var10 != local_38) {
        local_48 = (value_type *)(p_Var13 + 1);
        local_a0._32_8_ = p_Var13 + 0xf;
        local_a0._24_8_ = p_Var13 + 0x1d;
        local_a0._16_8_ = p_Var13;
        do {
          local_f8[0] = local_e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,p_Var13[1]._M_nxt,
                     (long)&(p_Var13[1]._M_nxt)->_M_nxt + (long)&(p_Var13[2]._M_nxt)->_M_nxt);
          boost::filesystem::path::parent_path();
          local_b0[0] = (mapped_type)local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b0,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          boost::filesystem::path::operator/=((path *)&local_118,(path *)local_b0);
          sVar3 = local_118._M_string_length;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p == &local_118.field_2) {
            local_d0.field_2._8_4_ = local_118.field_2._8_4_;
            local_d0.field_2._12_4_ = local_118.field_2._12_4_;
          }
          else {
            local_d0._M_dataplus._M_p = local_118._M_dataplus._M_p;
          }
          local_d0.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
          local_d0._M_string_length = local_118._M_string_length;
          local_118._M_string_length = 0;
          local_118.field_2._M_allocated_capacity =
               local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          local_78._M_dataplus._M_p = local_a0 + 0x38;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_a0 + 0x28),local_d0._M_dataplus._M_p,
                     local_d0._M_dataplus._M_p + (long)(_Hash_node_base **)sVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if (local_b0[0] != (mapped_type)local_a0) {
            operator_delete(local_b0[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
          if (((char)p_Var10[2]._M_color == _S_red) &&
             (cVar5 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(local_d8,(key_type *)(local_a0 + 0x28)),
             cVar5.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
             ._M_cur != (__node_type *)0x0)) {
            iVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(local_d8,(key_type *)(local_a0 + 0x28));
            local_118._M_dataplus._M_p =
                 (pointer)((long)iVar6.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                 ._M_cur + 0x28);
            *(undefined1 *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                    ._M_cur + 0x101) = 1;
            local_d0._M_dataplus._M_p = (pointer)local_a0._32_8_;
            std::
            _Hashtable<File*,File*,std::allocator<File*>,std::__detail::_Identity,std::equal_to<File*>,std::hash<File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<File*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<File*,false>>>>
                      ((_Hashtable<File*,File*,std::allocator<File*>,std::__detail::_Identity,std::equal_to<File*>,std::hash<File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_a0._32_8_,&local_118,&local_d0);
          }
          else {
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            p_Var1 = p_Var10[1]._M_parent;
            if (p_Var1 != (_Base_ptr)0x0) {
              lVar7 = *(long *)(p_Var10 + 1);
              p_Var14 = (_Base_ptr)0x0;
              do {
                tolower((int)*(char *)((long)&p_Var14->_M_color + lVar7));
                std::__cxx11::string::push_back((char)&local_d0);
                p_Var14 = (_Base_ptr)((long)&p_Var14->_M_color + 1);
              } while (p_Var1 != p_Var14);
            }
            __k = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_40,&local_d0);
            iVar4 = std::__cxx11::string::compare((char *)__k);
            if (iVar4 == 0) {
              this = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                   *)local_50._M_nxt,&local_d0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this,local_48);
            }
            else {
              lVar7 = std::__cxx11::string::find((char *)__k,0x12938c,0);
              if (lVar7 == 0) {
                p_Var13 = ((_Hash_node_base *)(local_a0._16_8_ + 0xe8))->_M_nxt;
                if (p_Var13 != (_Hash_node_base *)0x0) {
                  std::__cxx11::string::substr((ulong)&local_118,(ulong)__k);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)(p_Var13 + 0x2b),&local_118);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                  std::__cxx11::string::substr((ulong)local_f8,(ulong)__k);
                  plVar8 = (long *)std::__cxx11::string::replace
                                             ((ulong)local_f8,0,(char *)0x0,0x129397);
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar8 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar8 == paVar12) {
                    local_118.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_118.field_2._8_8_ = plVar8[3];
                  }
                  else {
                    local_118.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_118._M_dataplus._M_p = (pointer)*plVar8;
                  }
                  local_118._M_string_length = plVar8[1];
                  *plVar8 = (long)paVar12;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  ppCVar9 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[](local_58,&local_118);
                  pCVar2 = *ppCVar9;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                  if (local_f8[0] != local_e8) {
                    operator_delete(local_f8[0]);
                  }
                  local_b0[0] = pCVar2;
                  if (pCVar2 != (mapped_type)0x0) {
                    local_118._M_dataplus._M_p =
                         (pointer)(((_Hash_node_base *)(local_a0._16_8_ + 0xe8))->_M_nxt + 0xf);
                    std::
                    _Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<Component*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Component*,false>>>>
                              ((_Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)local_118._M_dataplus._M_p,local_b0,&local_118);
                  }
                }
              }
              else {
                cVar5 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(local_d8,__k);
                if (cVar5.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  iVar6 = std::
                          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find(local_d8,__k);
                  local_b0[0] = (mapped_type)
                                ((long)iVar6.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                       ._M_cur + 0x28);
                  local_118._M_dataplus._M_p = (pointer)local_a0._32_8_;
                  std::
                  _Hashtable<File*,File*,std::allocator<File*>,std::__detail::_Identity,std::equal_to<File*>,std::hash<File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<File*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<File*,false>>>>
                            ((_Hashtable<File*,File*,std::allocator<File*>,std::__detail::_Identity,std::equal_to<File*>,std::hash<File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_a0._32_8_,local_b0,&local_118);
                  std::__cxx11::string::substr((ulong)&local_118,(ulong)__k);
                  p_Var13 = (local_b0[0]->pubLinks)._M_h._M_before_begin._M_nxt[1]._M_nxt;
                  pcVar11 = ".";
                  if ((_Hash_node_base *)local_118._M_string_length == p_Var13) {
LAB_0011db20:
                    std::__cxx11::string::_M_replace
                              ((ulong)&local_118,0,(char *)local_118._M_string_length,(ulong)pcVar11
                              );
                  }
                  else {
                    if (local_118._M_string_length <=
                        (_Hash_node_base *)((long)&p_Var13->_M_nxt + 1)) {
                      pcVar11 = "";
                      goto LAB_0011db20;
                    }
                    std::__cxx11::string::substr((ulong)local_f8,(ulong)&local_118);
                    std::__cxx11::string::operator=((string *)&local_118,(string *)local_f8);
                    if (local_f8[0] != local_e8) {
                      operator_delete(local_f8[0]);
                    }
                  }
                  if ((_Hash_node_base *)local_118._M_string_length != (_Hash_node_base *)0x0) {
                    local_f8[0] = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                   *)&(local_b0[0]->privDeps)._M_h._M_before_begin;
                    std::
                    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    ::
                    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                              (local_f8[0],&local_118,local_f8);
                  }
                  if (*(_Hash_node_base **)local_a0._24_8_ !=
                      (local_b0[0]->pubLinks)._M_h._M_before_begin._M_nxt) {
                    local_f8[0] = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                   *)(*(_Hash_node_base **)local_a0._24_8_ + 0xf);
                    std::
                    _Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<Component*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Component*,false>>>>
                              ((_Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)local_f8[0],&(local_b0[0]->pubLinks)._M_h._M_before_begin,local_f8
                              );
                    local_f8[0] = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                   *)((local_b0[0]->pubLinks)._M_h._M_before_begin._M_nxt + 0x1d);
                    std::
                    _Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<Component*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Component*,false>>>>
                              ((_Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)local_f8[0],local_a0._24_8_,local_f8);
                    *(undefined1 *)&(local_b0[0]->pubLinks)._M_h._M_rehash_policy._M_next_resize = 1
                    ;
                  }
                  *(undefined1 *)
                   ((long)&(local_b0[0]->pubLinks)._M_h._M_rehash_policy._M_next_resize + 1) = 1;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                }
              }
            }
            p_Var13 = (_Hash_node_base *)local_a0._16_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
              p_Var13 = (_Hash_node_base *)local_a0._16_8_;
            }
          }
          if (local_78._M_dataplus._M_p != local_a0 + 0x38) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != local_38);
      }
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void MapIncludesToDependencies(std::unordered_map<std::string, std::string> &includeLookup,
                               std::map<std::string, std::vector<std::string>> &ambiguous,
                               std::unordered_map<std::string, Component *> &components, 
                               std::unordered_map<std::string, File>& files) {
    for (auto &fp : files) {
        for (auto &p : fp.second.rawIncludes) {
            // If this is a non-pointy bracket include, see if there's a local match first. 
            // If so, it always takes precedence, never needs an include path added, and never is ambiguous (at least, for the compiler).
            std::string fullFilePath = (filesystem::path(fp.first).parent_path() / p.first).generic_string();
            if (!p.second && files.count(fullFilePath)) {
                // This file exists as a local include.
                File* dep = &files.find(fullFilePath)->second;
                dep->hasInclude = true;
                fp.second.dependencies.insert(dep);
            } else {
                // We need to use an include path to find this. So let's see where we end up.
                std::string lowercaseInclude;
                std::transform(p.first.begin(), p.first.end(), std::back_inserter(lowercaseInclude), ::tolower);
                const std::string &fullPath = includeLookup[lowercaseInclude];
                if (fullPath == "INVALID") {
                    // We end up in more than one place. That's an ambiguous include then.
                    ambiguous[lowercaseInclude].push_back(fp.first);
                } else if (fullPath.find("GENERATED:") == 0) {
                    // We end up in a virtual file - it's not actually there yet, but it'll be generated.
                    if (fp.second.component) {
                        fp.second.component->buildAfters.insert(fullPath.substr(10));
                        Component *c = components["./" + fullPath.substr(10)];
                        if (c) {
                            fp.second.component->privDeps.insert(c);
                        }
                    }
                } else if (files.count(fullPath)) {
                    File *dep = &files.find(fullPath)->second;
                    fp.second.dependencies.insert(dep);

                    std::string inclpath = fullPath.substr(0, fullPath.size() - p.first.size() - 1);
                    if (inclpath.size() == dep->component->root.generic_string().size()) {
                        inclpath = ".";
                    } else if (inclpath.size() > dep->component->root.generic_string().size() + 1) {
                        inclpath = inclpath.substr(dep->component->root.generic_string().size() + 1);
                    } else {
                        inclpath = "";
                    }
                    if (!inclpath.empty()) {
                        dep->includePaths.insert(inclpath);
                    }

                    if (fp.second.component != dep->component) {
                        fp.second.component->privDeps.insert(dep->component);
                        dep->component->privLinks.insert(fp.second.component);
                        dep->hasExternalInclude = true;
                    }
                    dep->hasInclude = true;
                }
                // else we don't know about it. Probably a system include of some sort.
            }
        }
    }
}